

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ellswift_create(secp256k1_context *ctx,uchar *ell64,uchar *seckey32,uchar *auxrnd32)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar local_13c;
  secp256k1_sha256 local_138;
  secp256k1_ge p;
  secp256k1_fe t;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/ellswift/main_impl.h"
            ,0x1cb,"test condition failed: ctx != NULL");
    abort();
  }
  if (ell64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "ell64 != NULL";
  }
  else {
    ell64[0x30] = '\0';
    ell64[0x31] = '\0';
    ell64[0x32] = '\0';
    ell64[0x33] = '\0';
    ell64[0x34] = '\0';
    ell64[0x35] = '\0';
    ell64[0x36] = '\0';
    ell64[0x37] = '\0';
    ell64[0x38] = '\0';
    ell64[0x39] = '\0';
    ell64[0x3a] = '\0';
    ell64[0x3b] = '\0';
    ell64[0x3c] = '\0';
    ell64[0x3d] = '\0';
    ell64[0x3e] = '\0';
    ell64[0x3f] = '\0';
    ell64[0x20] = '\0';
    ell64[0x21] = '\0';
    ell64[0x22] = '\0';
    ell64[0x23] = '\0';
    ell64[0x24] = '\0';
    ell64[0x25] = '\0';
    ell64[0x26] = '\0';
    ell64[0x27] = '\0';
    ell64[0x28] = '\0';
    ell64[0x29] = '\0';
    ell64[0x2a] = '\0';
    ell64[0x2b] = '\0';
    ell64[0x2c] = '\0';
    ell64[0x2d] = '\0';
    ell64[0x2e] = '\0';
    ell64[0x2f] = '\0';
    ell64[0x10] = '\0';
    ell64[0x11] = '\0';
    ell64[0x12] = '\0';
    ell64[0x13] = '\0';
    ell64[0x14] = '\0';
    ell64[0x15] = '\0';
    ell64[0x16] = '\0';
    ell64[0x17] = '\0';
    ell64[0x18] = '\0';
    ell64[0x19] = '\0';
    ell64[0x1a] = '\0';
    ell64[0x1b] = '\0';
    ell64[0x1c] = '\0';
    ell64[0x1d] = '\0';
    ell64[0x1e] = '\0';
    ell64[0x1f] = '\0';
    ell64[0] = '\0';
    ell64[1] = '\0';
    ell64[2] = '\0';
    ell64[3] = '\0';
    ell64[4] = '\0';
    ell64[5] = '\0';
    ell64[6] = '\0';
    ell64[7] = '\0';
    ell64[8] = '\0';
    ell64[9] = '\0';
    ell64[10] = '\0';
    ell64[0xb] = '\0';
    ell64[0xc] = '\0';
    ell64[0xd] = '\0';
    ell64[0xe] = '\0';
    ell64[0xf] = '\0';
    if ((ctx->ecmult_gen_ctx).built == 0) {
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
    }
    else {
      if (seckey32 != (uchar *)0x0) {
        uVar1 = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx,&local_13c,&p,seckey32);
        secp256k1_declassify(ctx,&p,0x68);
        secp256k1_fe_normalize_var(&p.x);
        secp256k1_fe_normalize_var(&p.y);
        local_138.s[0] = 0xd29e1bf5;
        local_138.s[1] = 0xf7025f42;
        local_138.s[2] = 0x9b024773;
        local_138.s[3] = 0x94cb7d5;
        local_138.s[4] = 0xe59ed789;
        local_138.s[5] = 0x3bc9786;
        local_138.s[6] = 0x68335b35;
        local_138.s[7] = 0x4e363b53;
        local_138.bytes = 0x40;
        secp256k1_sha256_write(&local_138,seckey32,0x20);
        secp256k1_sha256_write(&local_138,"",0x20);
        secp256k1_declassify(ctx,&local_138,0x68);
        if (auxrnd32 != (uchar *)0x0) {
          secp256k1_sha256_write(&local_138,auxrnd32,0x20);
        }
        secp256k1_ellswift_elligatorswift_var(ell64,&t,&p,&local_138);
        secp256k1_fe_get_b32(ell64 + 0x20,&t);
        secp256k1_memczero(ell64,0x40,uVar1 ^ 1);
        return uVar1;
      }
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "seckey32 != NULL";
    }
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ellswift_create(const secp256k1_context *ctx, unsigned char *ell64, const unsigned char *seckey32, const unsigned char *auxrnd32) {
    secp256k1_ge p;
    secp256k1_fe t;
    secp256k1_sha256 hash;
    secp256k1_scalar seckey_scalar;
    int ret;
    static const unsigned char zero32[32] = {0};

    /* Sanity check inputs. */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    memset(ell64, 0, 64);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    /* Compute (affine) public key */
    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey32);
    secp256k1_declassify(ctx, &p, sizeof(p)); /* not constant time in produced pubkey */
    secp256k1_fe_normalize_var(&p.x);
    secp256k1_fe_normalize_var(&p.y);

    /* Set up hasher state. The used RNG is H(privkey || "\x00"*32 [|| auxrnd32] || cnt++),
     * using BIP340 tagged hash with tag "secp256k1_ellswift_create". */
    secp256k1_ellswift_sha256_init_create(&hash);
    secp256k1_sha256_write(&hash, seckey32, 32);
    secp256k1_sha256_write(&hash, zero32, sizeof(zero32));
    secp256k1_declassify(ctx, &hash, sizeof(hash)); /* private key is hashed now */
    if (auxrnd32) secp256k1_sha256_write(&hash, auxrnd32, 32);

    /* Compute ElligatorSwift encoding and construct output. */
    secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
    secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */

    secp256k1_memczero(ell64, 64, !ret);
    secp256k1_scalar_clear(&seckey_scalar);

    return ret;
}